

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_3::TextureFilteringTestCase::TextureFilteringTestCase
          (TextureFilteringTestCase *this,TestContext *testCtx,char *name,char *description)

{
  char *__s;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  TextureFilteringTestCase *this_local;
  
  local_28 = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureFilteringTestCase_01670908;
  de::details::
  MovePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::MovePtr(&this->m_executor);
  TestCaseData::TestCaseData(&this->m_testCaseData);
  shaderexecutor::ShaderSpec::ShaderSpec(&this->m_shaderSpec);
  return;
}

Assistant:

TextureFilteringTestCase (tcu::TestContext&	testCtx,
							  const char*		name,
							  const char*		description)
		: TestCase(testCtx, name, description)
	{
	}